

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVDB.h
# Opt level: O0

bool __thiscall
nanovdb::
ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>
::
isCached<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>
          (ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>
           *this,CoordValueType dirty)

{
  CoordValueType dirty_local;
  ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
  *this_local;
  bool local_1;
  
  if (*(long *)(this + 0x20) == 0) {
    local_1 = false;
  }
  else if ((dirty & 0xfffff000U) == 0) {
    local_1 = true;
  }
  else {
    *(undefined8 *)(this + 0x20) = 0;
    local_1 = false;
  }
  return local_1;
}

Assistant:

__hostdev__ bool isCached(CoordValueType dirty) const
    {
        if (!mNode[NodeT::LEVEL])
            return false;
        if (dirty & int32_t(~NodeT::MASK)) {
            mNode[NodeT::LEVEL] = nullptr;
            return false;
        }
        return true;
    }